

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPersistentManifold.cpp
# Opt level: O3

void __thiscall
cbtPersistentManifold::clearUserCache(cbtPersistentManifold *this,cbtManifoldPoint *pt)

{
  pt->reactions_cache[4] = 0.0;
  pt->reactions_cache[5] = 0.0;
  pt->reactions_cache[0] = 0.0;
  pt->reactions_cache[1] = 0.0;
  pt->reactions_cache[2] = 0.0;
  pt->reactions_cache[3] = 0.0;
  if ((pt->m_userPersistentData != (void *)0x0) &&
     (gContactDestroyedCallback != (ContactDestroyedCallback)0x0)) {
    (*gContactDestroyedCallback)(pt->m_userPersistentData);
    pt->m_userPersistentData = (void *)0x0;
  }
  return;
}

Assistant:

void cbtPersistentManifold::clearUserCache(cbtManifoldPoint& pt) {
    /* ***CHRONO*** */
    pt.reactions_cache[0] = pt.reactions_cache[1] = pt.reactions_cache[2] = 0;
    pt.reactions_cache[3] = pt.reactions_cache[4] = pt.reactions_cache[5] = 0;

	void* oldPtr = pt.m_userPersistentData;
	if (oldPtr)
	{
#ifdef DEBUG_PERSISTENCY
		int i;
		int occurance = 0;
		for (i = 0; i < m_cachedPoints; i++)
		{
			if (m_pointCache[i].m_userPersistentData == oldPtr)
			{
				occurance++;
				if (occurance > 1)
					printf("error in clearUserCache\n");
			}
		}
		cbtAssert(occurance <= 0);
#endif  //DEBUG_PERSISTENCY

		if (pt.m_userPersistentData && gContactDestroyedCallback)
		{
			(*gContactDestroyedCallback)(pt.m_userPersistentData);
			pt.m_userPersistentData = 0;
		}

#ifdef DEBUG_PERSISTENCY
		DebugPersistency();
#endif
	}
}